

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

file_status
ghc::filesystem::detail::status_ex
          (path *p,error_code *ec,file_status *sls,uintmax_t *sz,uintmax_t *nhl,time_t *lwt,
          int recurse_count)

{
  int iVar1;
  file_type fVar2;
  error_code eVar3;
  undefined4 in_stack_0000000c;
  stat st;
  int local_d8;
  undefined2 local_d4;
  __nlink_t *local_d0;
  int local_c8;
  undefined2 local_c4;
  stat local_c0;
  
  std::error_code::clear((error_code *)sls);
  iVar1 = lstat(*(char **)ec,&local_c0);
  if (iVar1 == 0) {
    local_d0 = (__nlink_t *)lwt;
    std::error_code::clear((error_code *)sls);
    file_status_from_st_mode<unsigned_int>((detail *)&local_d8,local_c0.st_mode);
    if (sz != (uintmax_t *)0x0) {
      *(int *)sz = local_d8;
      *(undefined2 *)((long)sz + 4) = local_d4;
    }
    if (local_d8 == 4) {
      iVar1 = stat(*(char **)ec,&local_c0);
      if (iVar1 != 0) goto LAB_0011b896;
      file_status_from_st_mode<unsigned_int>((detail *)&local_c8,local_c0.st_mode);
      local_d4 = local_c4;
      local_d8 = local_c8;
    }
    if (nhl != (uintmax_t *)0x0) {
      *nhl = local_c0.st_size;
    }
    if (local_d0 != (__nlink_t *)0x0) {
      *local_d0 = local_c0.st_nlink;
    }
    if ((__time_t *)CONCAT44(in_stack_0000000c,recurse_count) != (__time_t *)0x0) {
      *(__time_t *)CONCAT44(in_stack_0000000c,recurse_count) = local_c0.st_mtim.tv_sec;
    }
    *(int *)&(p->_path)._M_dataplus._M_p = local_d8;
    *(undefined2 *)((long)&(p->_path)._M_dataplus._M_p + 4) = local_d4;
  }
  else {
LAB_0011b896:
    eVar3 = make_system_error(0);
    fVar2 = eVar3._M_value;
    sls->_type = fVar2;
    sls[1] = (file_status)eVar3._M_cat;
    if ((fVar2 == 0x14) || (fVar2 == regular)) {
      *(undefined4 *)&(p->_path)._M_dataplus._M_p = 1;
    }
    else {
      *(undefined4 *)&(p->_path)._M_dataplus._M_p = 0;
    }
    *(undefined2 *)((long)&(p->_path)._M_dataplus._M_p + 4) = 0xffff;
  }
  return (file_status)p;
}

Assistant:

GHC_INLINE file_status status_ex(const path& p, std::error_code& ec, file_status* sls = nullptr, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr, int recurse_count = 0) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (recurse_count > 16) {
        ec = detail::make_system_error(0x2A9 /*ERROR_STOPPED_ON_SYMLINK*/);
        return file_status(file_type::unknown);
    }
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!::GetFileAttributesExW(GHC_NATIVEWP(p), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
        path target = resolveSymlink(p, ec);
        file_status result;
        if (!ec && !target.empty()) {
            if (sls) {
                *sls = status_from_INFO(p, &attr, ec);
            }
            return detail::status_ex(target, ec, nullptr, sz, nhl, lwt, recurse_count + 1);
        }
        return file_status(file_type::unknown);
    }
    if (ec) {
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found);
        }
        return file_status(file_type::none);
    }
    if (nhl) {
        *nhl = 0;
    }
    return detail::status_from_INFO(p, &attr, ec, sz, lwt);
#else
    (void)recurse_count;
    struct ::stat st;
    auto result = ::lstat(p.c_str(), &st);
    if (result == 0) {
        ec.clear();
        file_status fs = detail::file_status_from_st_mode(st.st_mode);
        if (sls) {
            *sls = fs;
        }
        if (fs.type() == file_type::symlink) {
            result = ::stat(p.c_str(), &st);
            if (result == 0) {
                fs = detail::file_status_from_st_mode(st.st_mode);
            }
            else {
                ec = detail::make_system_error();
                if (detail::is_not_found_error(ec)) {
                    return file_status(file_type::not_found, perms::unknown);
                }
                return file_status(file_type::none);
            }
        }
        if (sz) {
            *sz = static_cast<uintmax_t>(st.st_size);
        }
        if (nhl) {
            *nhl = st.st_nlink;
        }
        if (lwt) {
            *lwt = st.st_mtime;
        }
        return fs;
    }
    else {
        ec = detail::make_system_error();
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found, perms::unknown);
        }
        return file_status(file_type::none);
    }
#endif
}